

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<kj::Exception&>
               (char *file,int line,LogSeverity severity,char *macroArgs,Exception *params)

{
  ArrayPtr<kj::String> argValues_00;
  String argValues [1];
  String *local_48;
  size_t local_40;
  undefined8 *puStack_38;
  
  kj::operator*(&local_48,params);
  argValues_00.size_ = local_40;
  argValues_00.ptr = local_48;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff98,argValues_00);
  if (local_48 != (String *)0x0) {
    (**(code **)*puStack_38)(puStack_38,local_48,1,local_40,local_40,0);
  }
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}